

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  IRContext *this_00;
  DecorationManager *this_01;
  Instruction *this_02;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  DescriptorSetAndBinding *pDVar7;
  pointer ppIVar8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  this_01 = (this_00->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar1 = 0;
  if (inst->has_result_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  bVar5 = false;
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_01,uVar1,false);
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
    bVar2 = false;
    ppIVar8 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_02 = *ppIVar8;
      uVar6 = (this_02->has_result_id_ & 1) + 1;
      if (this_02->has_type_id_ == false) {
        uVar6 = (uint)this_02->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(this_02,uVar6 + 1);
      if (uVar1 == 0x21) {
        bVar3 = true;
        pDVar7 = (DescriptorSetAndBinding *)&descriptor_set_binding->binding;
        bVar4 = bVar5;
        if (bVar2) {
          __assert_fail("false && \"A resource has two OpDecorate for the binding\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                        ,0x65,
                        "bool spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding(const Instruction &, DescriptorSetAndBinding *) const"
                       );
        }
LAB_005819d6:
        uVar6 = (this_02->has_result_id_ & 1) + 1;
        if (this_02->has_type_id_ == false) {
          uVar6 = (uint)this_02->has_result_id_;
        }
        uVar1 = Instruction::GetSingleWordOperand(this_02,uVar6 + 2);
        pDVar7->descriptor_set = uVar1;
        bVar5 = bVar4;
        bVar2 = bVar3;
      }
      else if (uVar1 == 0x22) {
        pDVar7 = descriptor_set_binding;
        bVar4 = true;
        bVar3 = bVar2;
        if (bVar5) {
          __assert_fail("false && \"A resource has two OpDecorate for the descriptor set\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                        ,0x5d,
                        "bool spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding(const Instruction &, DescriptorSetAndBinding *) const"
                       );
        }
        goto LAB_005819d6;
      }
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 !=
             local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar5 = (bool)(bVar5 & bVar2);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool ConvertToSampledImagePass::GetDescriptorSetBinding(
    const Instruction& inst,
    DescriptorSetAndBinding* descriptor_set_binding) const {
  auto* decoration_manager = context()->get_decoration_mgr();
  bool found_descriptor_set_to_convert = false;
  bool found_binding_to_convert = false;
  for (auto decorate :
       decoration_manager->GetDecorationsFor(inst.result_id(), false)) {
    spv::Decoration decoration =
        spv::Decoration(decorate->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::DescriptorSet) {
      if (found_descriptor_set_to_convert) {
        assert(false && "A resource has two OpDecorate for the descriptor set");
        return false;
      }
      descriptor_set_binding->descriptor_set =
          decorate->GetSingleWordInOperand(2u);
      found_descriptor_set_to_convert = true;
    } else if (decoration == spv::Decoration::Binding) {
      if (found_binding_to_convert) {
        assert(false && "A resource has two OpDecorate for the binding");
        return false;
      }
      descriptor_set_binding->binding = decorate->GetSingleWordInOperand(2u);
      found_binding_to_convert = true;
    }
  }
  return found_descriptor_set_to_convert && found_binding_to_convert;
}